

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recvstate.c
# Opt level: O3

int quicly_recvstate_update
              (quicly_recvstate_t *state,uint64_t off,size_t *len,int is_fin,size_t max_ranges)

{
  quicly_range_t *pqVar1;
  size_t sVar2;
  int iVar3;
  uint64_t uVar4;
  ulong uVar5;
  quicly_range_t *__ptr;
  size_t sVar6;
  
  sVar2 = (state->received).num_ranges;
  if (sVar2 == 0) {
    __assert_fail("!quicly_recvstate_transfer_complete(state)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/recvstate.c"
                  ,0x30,
                  "int quicly_recvstate_update(quicly_recvstate_t *, uint64_t, size_t *, int, size_t)"
                 );
  }
  if (state->eos == 0xffffffffffffffff) {
    sVar6 = *len;
    if (is_fin != 0) {
      state->eos = sVar6 + off;
      if (sVar6 + off < (state->received).ranges[sVar2 - 1].end) {
        return 0x20006;
      }
      sVar6 = *len;
    }
  }
  else {
    sVar6 = *len;
    if (state->eos < sVar6 + off) {
      return 0x20006;
    }
  }
  uVar5 = state->data_off;
  if (uVar5 < sVar6 + off) {
    if (off < uVar5) {
      sVar6 = sVar6 + (off - uVar5);
      *len = sVar6;
      off = uVar5;
    }
    if (sVar6 == 0) {
      uVar5 = (state->received).num_ranges;
    }
    else {
      iVar3 = quicly_ranges_add(&state->received,off,sVar6 + off);
      if (iVar3 != 0) {
        return iVar3;
      }
      uVar5 = (state->received).num_ranges;
      if (max_ranges < uVar5) {
        return 0xff07;
      }
    }
    if (uVar5 != 1) {
      return 0;
    }
    __ptr = (state->received).ranges;
    if (__ptr->start != 0) {
      return 0;
    }
    uVar4 = __ptr->end;
  }
  else {
    *len = 0;
    __ptr = (state->received).ranges;
    uVar4 = __ptr->end;
  }
  if (uVar4 == state->eos) {
    pqVar1 = &(state->received)._initial;
    if (__ptr != pqVar1) {
      free(__ptr);
      (state->received).ranges = pqVar1;
    }
    (state->received).num_ranges = 0;
    (state->received).capacity = 1;
  }
  return 0;
}

Assistant:

int quicly_recvstate_update(quicly_recvstate_t *state, uint64_t off, size_t *len, int is_fin, size_t max_ranges)
{
    int ret;

    assert(!quicly_recvstate_transfer_complete(state));

    /* eos handling */
    if (state->eos == UINT64_MAX) {
        if (is_fin) {
            state->eos = off + *len;
            if (state->eos < state->received.ranges[state->received.num_ranges - 1].end)
                return QUICLY_TRANSPORT_ERROR_FINAL_SIZE;
        }
    } else {
        if (off + *len > state->eos)
            return QUICLY_TRANSPORT_ERROR_FINAL_SIZE;
    }

    /* no state change; entire data has already been received */
    if (off + *len <= state->data_off) {
        *len = 0;
        if (state->received.ranges[0].end == state->eos)
            goto Complete;
        return 0;
    }

    /* adjust if partially received */
    if (off < state->data_off) {
        size_t delta = state->data_off - off;
        off += delta;
        *len -= delta;
    }

    /* update received range */
    if (*len != 0) {
        if ((ret = quicly_ranges_add(&state->received, off, off + *len)) != 0)
            return ret;
        if (state->received.num_ranges > max_ranges)
            return QUICLY_ERROR_STATE_EXHAUSTION;
    }
    if (state->received.num_ranges == 1 && state->received.ranges[0].start == 0 && state->received.ranges[0].end == state->eos)
        goto Complete;

    return 0;

Complete:
    quicly_ranges_clear(&state->received);
    return 0;
}